

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O2

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx>::weight_from_sin
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx> *this,
          PolarExtentCoreContext *ctx,batch sin_angle)

{
  undefined4 uVar1;
  float fVar2;
  bool bVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  batch *pbVar4;
  batch<float,_xsimd::avx> *x;
  xsimd *this_00;
  float fVar5;
  float fVar13;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  batch_bool<float,_xsimd::avx> start;
  batch_bool<float,_xsimd::avx> local_c0;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  batch_bool<float,_xsimd::avx> local_80;
  batch<float,_xsimd::avx> local_60 [2];
  
  local_60[0].super_simd_register<float,_xsimd::avx>.data = in_ZMM0._0_32_;
  uVar1 = *(undefined4 *)&this[0x10].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar14._16_4_ = uVar1;
  auVar14._20_4_ = uVar1;
  auVar14._24_4_ = uVar1;
  auVar14._28_4_ = uVar1;
  local_80.super_get_bool_simd_register_t<float,_xsimd::avx>.data =
       (get_bool_simd_register_t<float,_xsimd::avx>)
       vcmpps_avx((undefined1  [32])local_60[0].super_simd_register<float,_xsimd::avx>.data,auVar14,
                  2);
  uVar1 = *(undefined4 *)((long)&this[0x10].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar15._16_4_ = uVar1;
  auVar15._20_4_ = uVar1;
  auVar15._24_4_ = uVar1;
  auVar15._28_4_ = uVar1;
  local_c0.super_get_bool_simd_register_t<float,_xsimd::avx>.data =
       (get_bool_simd_register_t<float,_xsimd::avx>)
       vcmpps_avx(auVar15,(undefined1  [32])local_60[0].super_simd_register<float,_xsimd::avx>.data,
                  2);
  this_00 = (xsimd *)this;
  bVar3 = xsimd::all<float,xsimd::avx>(&local_80);
  pbVar4 = (batch *)CONCAT71(extraout_var,bVar3);
  if (!bVar3) {
    bVar3 = xsimd::all<float,xsimd::avx>(&local_c0);
    pbVar4 = (batch *)CONCAT71(extraout_var_00,bVar3);
    if (!bVar3) {
      fVar5 = *(float *)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore;
      fVar7 = 0.0;
      fVar8 = 0.0;
      fVar9 = 0.0;
      fVar10 = 0.0;
      fVar11 = 0.0;
      fVar12 = 0.0;
      fVar13 = 0.0;
      local_a0 = fVar5;
      fStack_9c = fVar5;
      fStack_98 = fVar5;
      fStack_94 = fVar5;
      fStack_90 = fVar5;
      fStack_8c = fVar5;
      fStack_88 = fVar5;
      fStack_84 = fVar5;
      pbVar4 = xsimd::asin<float,xsimd::avx>(local_60,this_00,x);
      fVar2 = *(float *)((long)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore + 4);
      auVar6._0_4_ = fVar5 * local_a0 + fVar2;
      auVar6._4_4_ = fVar7 * fStack_9c + fVar2;
      auVar6._8_4_ = fVar8 * fStack_98 + fVar2;
      auVar6._12_4_ = fVar9 * fStack_94 + fVar2;
      auVar6._16_4_ = fVar10 * fStack_90 + fVar2;
      auVar6._20_4_ = fVar11 * fStack_8c + fVar2;
      auVar6._24_4_ = fVar12 * fStack_88 + fVar2;
      auVar6._28_4_ = fVar13 + fVar2;
      auVar14 = vblendvps_avx(auVar6,ZEXT1632(ZEXT816(0) << 0x40),
                              (undefined1  [32])
                              local_c0.super_get_bool_simd_register_t<float,_xsimd::avx>.data);
      auVar16._8_4_ = 0x3f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._12_4_ = 0x3f800000;
      auVar16._16_4_ = 0x3f800000;
      auVar16._20_4_ = 0x3f800000;
      auVar16._24_4_ = 0x3f800000;
      auVar16._28_4_ = 0x3f800000;
      vblendvps_avx(auVar14,auVar16,
                    (undefined1  [32])
                    local_80.super_get_bool_simd_register_t<float,_xsimd::avx>.data);
    }
  }
  return pbVar4;
}

Assistant:

batch weight_from_sin(PolarExtentCoreContext &ctx, batch sin_angle) const {
      auto start = sin_angle <= ctx.sin_start_angle;
      auto end = sin_angle >= ctx.sin_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::asin(sin_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }